

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

bool __thiscall ProString::operator==(ProString *this,QLatin1String other)

{
  bool bVar1;
  long in_FS_OFFSET;
  QLatin1StringView local_38;
  QStringView local_28;
  long local_18;
  
  local_38.m_data = other.m_data;
  local_38.m_size = other.m_size;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.m_data = (this->m_string).d.ptr;
  local_28.m_size = (this->m_string).d.size;
  local_28 = QStringView::mid(&local_28,(long)this->m_offset,(long)this->m_length);
  bVar1 = comparesEqual(&local_38,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(QLatin1String other) const  { return toQStringView() == other; }